

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall resetOnEndTimeFixture::resetOnEndTimeFixture(resetOnEndTimeFixture *this)

{
  resetOnEndTimeFixture *this_local;
  
  anon_unknown.dwarf_2926b4::acceptorFixture::acceptorFixture(&this->super_acceptorFixture);
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__resetOnEndTimeFixture_0050aff0;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application = (_func_int **)&PTR__resetOnEndTimeFixture_0050b048;
  return;
}

Assistant:

void createSession() {
    now.setCurrent();
    startTimeStamp = now;
    startTimeStamp.setMillisecond(0);

    endTimeStamp = startTimeStamp;

    startTime = UtcTimeOnly(startTimeStamp);
    endTime = UtcTimeOnly(endTimeStamp);
    endTime += 2;

    acceptorFixture::createSession(0);
  }